

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O2

void qsoundc_write_data(void *info,UINT8 address,UINT16 data)

{
  UINT16 *pUVar1;
  undefined3 in_register_00000031;
  
  pUVar1 = *(UINT16 **)((long)info + (ulong)CONCAT31(in_register_00000031,address) * 8 + 0x14a0);
  if (pUVar1 != (UINT16 *)0x0) {
    *pUVar1 = data;
  }
  *(undefined1 *)((long)info + 0x149c) = 0;
  return;
}

Assistant:

static void qsoundc_write_data(void* info, UINT8 address, UINT16 data)
{
	struct qsound_chip* chip = (struct qsound_chip*)info;
	
	UINT16 *destination = chip->register_map[address];
	if(destination)
		*destination = data;
	chip->ready_flag = 0;

	return;
}